

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall wasm::TranslateToFuzzReader::addImportLoggingSupport(TranslateToFuzzReader *this)

{
  long *plVar1;
  pointer pTVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Function *pFVar7;
  undefined8 *puVar8;
  mapped_type *pmVar9;
  Expression *pEVar10;
  ulong uVar11;
  pointer pTVar12;
  Signature SVar13;
  string_view root;
  string_view sVar14;
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  key_type local_60;
  Type type;
  long local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  Function *local_38;
  __single_object func;
  
  pTVar12 = (this->loggableTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (this->loggableTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pTVar12 != pTVar2) {
    do {
      local_60.id = pTVar12->id;
      pFVar7 = (Function *)operator_new(0x1d8);
      memset(pFVar7,0,0x1d8);
      wasm::HeapType::HeapType(&pFVar7->type,(Signature)ZEXT816(0));
      pFVar7->profile = Normal;
      (pFVar7->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pFVar7->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pFVar7->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pFVar7->body = (Expression *)0x0;
      (pFVar7->localNames)._M_h._M_buckets = &(pFVar7->localNames)._M_h._M_single_bucket;
      (pFVar7->localNames)._M_h._M_bucket_count = 1;
      (pFVar7->localNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (pFVar7->localNames)._M_h._M_element_count = 0;
      (pFVar7->localNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (pFVar7->localNames)._M_h._M_rehash_policy._M_next_resize = 0;
      (pFVar7->localNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (pFVar7->localIndices)._M_h._M_buckets = &(pFVar7->localIndices)._M_h._M_single_bucket;
      (pFVar7->localIndices)._M_h._M_bucket_count = 1;
      (pFVar7->localIndices)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (pFVar7->localIndices)._M_h._M_element_count = 0;
      (pFVar7->localIndices)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (pFVar7->localIndices)._M_h._M_rehash_policy._M_next_resize = 0;
      (pFVar7->localIndices)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (pFVar7->debugLocations)._M_h._M_buckets = &(pFVar7->debugLocations)._M_h._M_single_bucket;
      (pFVar7->debugLocations)._M_h._M_bucket_count = 1;
      (pFVar7->debugLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (pFVar7->debugLocations)._M_h._M_element_count = 0;
      (pFVar7->debugLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (pFVar7->debugLocations)._M_h._M_rehash_policy._M_next_resize = 0;
      (pFVar7->debugLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (pFVar7->prologLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
      (pFVar7->epilogLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
      (pFVar7->expressionLocations)._M_h._M_buckets =
           &(pFVar7->expressionLocations)._M_h._M_single_bucket;
      (pFVar7->expressionLocations)._M_h._M_bucket_count = 1;
      (pFVar7->expressionLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (pFVar7->expressionLocations)._M_h._M_element_count = 0;
      (pFVar7->expressionLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (pFVar7->expressionLocations)._M_h._M_rehash_policy._M_next_resize = 0;
      (pFVar7->expressionLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (pFVar7->delimiterLocations)._M_h._M_buckets =
           &(pFVar7->delimiterLocations)._M_h._M_single_bucket;
      (pFVar7->delimiterLocations)._M_h._M_bucket_count = 1;
      (pFVar7->delimiterLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (pFVar7->delimiterLocations)._M_h._M_element_count = 0;
      (pFVar7->delimiterLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      *(undefined8 *)((long)&(pFVar7->delimiterLocations)._M_h._M_single_bucket + 4) = 0;
      (pFVar7->funcLocation).declarations = 0;
      (pFVar7->funcLocation).end = 0;
      (pFVar7->delimiterLocations)._M_h._M_rehash_policy._M_next_resize = 0;
      (pFVar7->delimiterLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (pFVar7->effects).super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      (pFVar7->effects).super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pFVar7->noFullInline = false;
      pFVar7->noPartialInline = false;
      local_a0 = local_90;
      local_38 = pFVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"log-","");
      wasm::Type::toString_abi_cxx11_();
      uVar11 = 0xf;
      if (local_a0 != local_90) {
        uVar11 = local_90[0];
      }
      if (uVar11 < (ulong)(local_78 + local_98)) {
        uVar11 = 0xf;
        if (local_80 != local_70) {
          uVar11 = local_70[0];
        }
        if (uVar11 < (ulong)(local_78 + local_98)) goto LAB_001269f0;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_a0);
      }
      else {
LAB_001269f0:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80);
      }
      plVar1 = puVar8 + 2;
      if ((long *)*puVar8 == plVar1) {
        local_48 = *plVar1;
        uStack_40 = *(undefined4 *)(puVar8 + 3);
        uStack_3c = *(undefined4 *)((long)puVar8 + 0x1c);
        type.id = (uintptr_t)&local_48;
      }
      else {
        local_48 = *plVar1;
        type.id = (uintptr_t)*puVar8;
      }
      uVar3 = puVar8[1];
      *puVar8 = plVar1;
      puVar8[1] = 0;
      *(undefined1 *)plVar1 = 0;
      root = (string_view)wasm::IString::interned(uVar3,type.id,0);
      if ((long *)type.id != &local_48) {
        operator_delete((void *)type.id,local_48 + 1);
      }
      if (local_80 != local_70) {
        operator_delete(local_80,local_70[0] + 1);
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0,local_90[0] + 1);
      }
      sVar14 = (string_view)Names::getValidFunctionName(this->wasm,(Name)root);
      pFVar7 = local_38;
      (local_38->super_Importable).super_Named.name.super_IString.str = sVar14;
      pmVar9 = std::__detail::
               _Map_base<wasm::Type,_std::pair<const_wasm::Type,_wasm::Name>,_std::allocator<std::pair<const_wasm::Type,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_wasm::Name>,_std::allocator<std::pair<const_wasm::Type,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->logImportNames,&local_60);
      uVar4 = *(undefined4 *)
               ((long)&(pFVar7->super_Importable).super_Named.name.super_IString.str._M_len + 4);
      uVar5 = *(undefined4 *)&(pFVar7->super_Importable).super_Named.name.super_IString.str._M_str;
      uVar6 = *(undefined4 *)
               ((long)&(pFVar7->super_Importable).super_Named.name.super_IString.str._M_str + 4);
      *(int *)&(pmVar9->super_IString).str._M_len =
           (int)(pFVar7->super_Importable).super_Named.name.super_IString.str._M_len;
      *(undefined4 *)((long)&(pmVar9->super_IString).str._M_len + 4) = uVar4;
      *(undefined4 *)&(pmVar9->super_IString).str._M_str = uVar5;
      *(undefined4 *)((long)&(pmVar9->super_IString).str._M_str + 4) = uVar6;
      if (this->preserveImportsAndExports == false) {
        sVar14 = (string_view)wasm::IString::interned(0xf,"fuzzing-support",0);
        (local_38->super_Importable).module.super_IString.str = sVar14;
        (local_38->super_Importable).base.super_IString.str = root;
      }
      else {
        pEVar10 = (Expression *)
                  MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x200),0x10,8);
        pEVar10->_id = NopId;
        (pEVar10->type).id = 0;
        local_38->body = pEVar10;
      }
      SVar13.results.id = 0;
      SVar13.params.id = local_60.id;
      wasm::HeapType::HeapType((HeapType *)&type,SVar13);
      (local_38->type).id = type.id;
      wasm::Module::addFunction((unique_ptr *)this->wasm);
      if (local_38 != (Function *)0x0) {
        std::default_delete<wasm::Function>::operator()
                  ((default_delete<wasm::Function> *)&local_38,local_38);
      }
      pTVar12 = pTVar12 + 1;
    } while (pTVar12 != pTVar2);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::addImportLoggingSupport() {
  for (auto type : loggableTypes) {
    auto func = std::make_unique<Function>();
    Name baseName = std::string("log-") + type.toString();
    func->name = Names::getValidFunctionName(wasm, baseName);
    logImportNames[type] = func->name;
    if (!preserveImportsAndExports) {
      func->module = "fuzzing-support";
      func->base = baseName;
    } else {
      // We cannot add an import, so just make it a trivial function (this is
      // simpler than avoiding calls to logging in all the rest of the logic).
      func->body = builder.makeNop();
    }
    func->type = Signature(type, Type::none);
    wasm.addFunction(std::move(func));
  }
}